

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

int __thiscall
lzham::adaptive_arith_data_model::init(adaptive_arith_data_model *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar2;
  uint32 in_EDX;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar3;
  undefined1 local_1;
  
  uVar3 = CONCAT13((char)ctx,in_stack_ffffffffffffffec) & 0x1ffffff;
  if (in_EDX == 0) {
    clear((adaptive_arith_data_model *)0x13ce71);
    local_1 = 1;
    uVar2 = extraout_var;
    goto LAB_0013cec4;
  }
  if (in_EDX < 2) {
LAB_0013ce8c:
    in_EDX = math::next_pow2(in_EDX);
  }
  else {
    bVar1 = math::is_power_of_2(in_EDX);
    if (!bVar1) goto LAB_0013ce8c;
  }
  this->m_total_syms = in_EDX;
  bVar1 = vector<lzham::adaptive_bit_model>::try_resize
                    ((vector<lzham::adaptive_bit_model> *)CONCAT44(uVar3,in_EDX),
                     (uint)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
  uVar2 = extraout_var_00;
  if (bVar1) {
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_0013cec4:
  return (int)CONCAT71(uVar2,local_1);
}

Assistant:

bool adaptive_arith_data_model::init(bool encoding, uint total_syms)
   {
      encoding;
      if (!total_syms)
      {
         clear();
         return true;
      }

      if ((total_syms < 2) || (!math::is_power_of_2(total_syms)))
         total_syms = math::next_pow2(total_syms);

      m_total_syms = total_syms;

      if (!m_probs.try_resize(m_total_syms))
         return false;

      return true;
   }